

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

int hydro_unpad(uchar *buf,size_t padded_buflen,size_t blocksize)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  ulong local_18;
  size_t pad_len;
  
  iVar3 = -1;
  local_18 = 0;
  if (blocksize - 1 < padded_buflen) {
    pbVar1 = buf + (padded_buflen - 1);
    uVar4 = 0;
    bVar5 = 0;
    for (uVar6 = 0; blocksize != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = uVar4 + 0x1ff;
      uVar4 = uVar4 | *pbVar1;
      uVar2 = (*pbVar1 ^ 0x80) - 1 & (int)local_18 + 0x1ffU & uVar2;
      pbVar1 = pbVar1 + -1;
      bVar5 = bVar5 | (byte)(uVar2 >> 8) & 1;
      local_18 = local_18 | -(ulong)((uVar2 >> 8 & 1) != 0) & uVar6;
    }
    if (bVar5 != 0) {
      iVar3 = ((int)padded_buflen + -1) - (int)local_18;
    }
  }
  return iVar3;
}

Assistant:

int
hydro_unpad(const unsigned char *buf, size_t padded_buflen, size_t blocksize)
{
    const unsigned char *tail;
    unsigned char        acc = 0U;
    unsigned char        c;
    unsigned char        valid   = 0U;
    volatile size_t      pad_len = 0U;
    size_t               i;
    size_t               is_barrier;

    if (padded_buflen < blocksize || blocksize <= 0U) {
        return -1;
    }
    tail = &buf[padded_buflen - 1U];

    for (i = 0U; i < blocksize; i++) {
        c          = *(tail - i);
        is_barrier = (((acc - 1U) & (pad_len - 1U) & ((c ^ 0x80) - 1U)) >> 8) & 1U;
        acc |= c;
        pad_len |= i & (1U + ~is_barrier);
        valid |= (unsigned char) is_barrier;
    }
    if (valid == 0) {
        return -1;
    }
    return (int) (padded_buflen - 1 - pad_len);
}